

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  xmlElementType xVar1;
  xmlDictPtr dict_00;
  xmlNsPtr pxVar2;
  bool bVar3;
  bool bVar4;
  xmlNodePtr pxVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlDictPtr newNs;
  xmlEntityPtr pxVar8;
  xmlNsMapItemPtr_conflict pxVar9;
  xmlNodePtr local_f0;
  xmlChar *idVal;
  int res;
  xmlEntityPtr ent;
  xmlDictPtr dict;
  xmlNsPtr *cloneNsDefSlot;
  xmlNsPtr cloneNs;
  xmlNodePtr prevClone;
  xmlNodePtr parentClone;
  xmlNodePtr clone;
  xmlNodePtr resultClone;
  int ancestorsOnly;
  int parnsdone;
  int depth;
  xmlNsPtr ns;
  xmlNsMapItemPtr_conflict mi;
  xmlNsMapPtr nsMap;
  xmlNodePtr cloneElem;
  xmlNodePtr cur;
  xmlNodePtr pxStack_40;
  int ret;
  xmlNodePtr destParent_local;
  xmlDocPtr destDoc_local;
  xmlNodePtr *resNode_local;
  xmlNodePtr node_local;
  xmlDocPtr sourceDoc_local;
  xmlDOMWrapCtxtPtr_conflict ctxt_local;
  
  cur._4_4_ = 0;
  nsMap = (xmlNsMapPtr)0x0;
  mi = (xmlNsMapItemPtr_conflict)0x0;
  ancestorsOnly = -1;
  bVar4 = false;
  clone = (xmlNodePtr)0x0;
  prevClone = (xmlNodePtr)0x0;
  cloneNs = (xmlNsPtr)0x0;
  if ((((node == (xmlNodePtr)0x0) || (resNode == (xmlNodePtr *)0x0)) || (destDoc == (xmlDocPtr)0x0))
     || ((destParent != (xmlNodePtr)0x0 && (destParent->doc != destDoc)))) {
    ctxt_local._4_4_ = -1;
  }
  else if (node->type == XML_ELEMENT_NODE) {
    if (((node->doc == (_xmlDoc *)0x0) || (sourceDoc == (xmlDocPtr)0x0)) || (node->doc == sourceDoc)
       ) {
      node_local = (xmlNodePtr)sourceDoc;
      if (sourceDoc == (xmlDocPtr)0x0) {
        node_local = (xmlNodePtr)node->doc;
      }
      if (node_local == (xmlNodePtr)0x0) {
        ctxt_local._4_4_ = -1;
      }
      else {
        dict_00 = destDoc->dict;
        if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
          mi = (xmlNsMapItemPtr_conflict)ctxt->namespaceMap;
        }
        *resNode = (xmlNodePtr)0x0;
        cloneElem = node;
        pxStack_40 = destParent;
        destParent_local = (xmlNodePtr)destDoc;
        destDoc_local = (xmlDocPtr)resNode;
        resNode_local = (xmlNodePtr *)node;
        sourceDoc_local = (xmlDocPtr)ctxt;
LAB_0016bd0a:
        if (cloneElem != (xmlNodePtr)0x0) {
          if (cloneElem->doc != (_xmlDoc *)node_local) goto LAB_0016c862;
          xVar1 = cloneElem->type;
          if (xVar1 != XML_ELEMENT_NODE) {
            if (xVar1 == XML_ATTRIBUTE_NODE) {
              parentClone = (xmlNodePtr)(*xmlMalloc)(0x68);
              if (parentClone != (xmlNodePtr)0x0) {
                memset(parentClone,0,0x68);
                pxVar5 = parentClone;
                if (clone != (xmlNodePtr)0x0) {
                  parentClone->parent = prevClone;
                  if (cloneNs == (xmlNsPtr)0x0) {
                    prevClone->properties = (_xmlAttr *)parentClone;
                    pxVar5 = clone;
                  }
                  else {
                    cloneNs[1].next = (_xmlNs *)parentClone;
                    parentClone->prev = (_xmlNode *)cloneNs;
                    pxVar5 = clone;
                  }
                }
                goto LAB_0016beef;
              }
            }
            else if (((xVar1 - XML_TEXT_NODE < 3) || (xVar1 - XML_PI_NODE < 2)) ||
                    (xVar1 == XML_DOCUMENT_FRAG_NODE)) goto LAB_0016bd93;
            goto LAB_0016c862;
          }
LAB_0016bd93:
          parentClone = (xmlNodePtr)(*xmlMalloc)(0x78);
          if (parentClone == (_xmlNode *)0x0) goto LAB_0016c862;
          memset(parentClone,0,0x78);
          pxVar5 = parentClone;
          if (clone != (xmlNodePtr)0x0) {
            parentClone->parent = prevClone;
            if (cloneNs == (xmlNsPtr)0x0) {
              prevClone->children = parentClone;
            }
            else {
              cloneNs[1].next = (_xmlNs *)parentClone;
              parentClone->prev = (_xmlNode *)cloneNs;
            }
            prevClone->last = parentClone;
            pxVar5 = clone;
          }
LAB_0016beef:
          clone = pxVar5;
          parentClone->type = cloneElem->type;
          parentClone->doc = (_xmlDoc *)destParent_local;
          if (cloneElem->name == "text") {
            parentClone->name = "text";
          }
          else if (cloneElem->name == "textnoenc") {
            parentClone->name = "textnoenc";
          }
          else if (cloneElem->name == "comment") {
            parentClone->name = "comment";
          }
          else if (cloneElem->name != (xmlChar *)0x0) {
            if (dict_00 == (xmlDictPtr)0x0) {
              pxVar7 = xmlStrdup(cloneElem->name);
              parentClone->name = pxVar7;
            }
            else {
              pxVar7 = xmlDictLookup(dict_00,cloneElem->name,-1);
              parentClone->name = pxVar7;
            }
            if (parentClone->name == (xmlChar *)0x0) goto LAB_0016c862;
          }
          switch(cloneElem->type) {
          case XML_ELEMENT_NODE:
            nsMap = (xmlNsMapPtr)parentClone;
            ancestorsOnly = ancestorsOnly + 1;
            if (cloneElem->nsDef != (xmlNs *)0x0) {
              if (!bVar4) {
                if (((pxStack_40 != (xmlNodePtr)0x0) && (sourceDoc_local == (xmlDocPtr)0x0)) &&
                   (iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,pxStack_40),
                   iVar6 == -1)) break;
                bVar4 = true;
              }
              dict = (xmlDictPtr)&parentClone->nsDef;
              for (_parnsdone = cloneElem->nsDef; _parnsdone != (xmlNsPtr)0x0;
                  _parnsdone = _parnsdone->next) {
                newNs = (xmlDictPtr)(*xmlMalloc)(0x30);
                if (newNs == (xmlDictPtr)0x0) goto LAB_0016c862;
                memset(newNs,0,0x30);
                *(xmlNsType *)&newNs->table = XML_NAMESPACE_DECL;
                if (_parnsdone->href != (xmlChar *)0x0) {
                  pxVar7 = xmlStrdup(_parnsdone->href);
                  newNs->size = (size_t)pxVar7;
                  if ((xmlChar *)newNs->size == (xmlChar *)0x0) {
                    xmlFreeNs((xmlNsPtr)newNs);
                    goto LAB_0016c862;
                  }
                }
                if (_parnsdone->prefix != (xmlChar *)0x0) {
                  pxVar7 = xmlStrdup(_parnsdone->prefix);
                  *(xmlChar **)&newNs->nbElems = pxVar7;
                  if (*(xmlChar **)&newNs->nbElems == (xmlChar *)0x0) {
                    xmlFreeNs((xmlNsPtr)newNs);
                    goto LAB_0016c862;
                  }
                }
                *(xmlDictPtr *)dict = newNs;
                if ((sourceDoc_local == (xmlDocPtr)0x0) ||
                   (sourceDoc_local->children == (_xmlNode *)0x0)) {
                  if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
                    for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
                      if (((-2 < *(int *)((long)&ns->_private + 4)) && (*(int *)&ns->_private == -1)
                          ) && ((_parnsdone->prefix == *(xmlChar **)(ns->prefix + 0x18) ||
                                (iVar6 = xmlStrEqual(_parnsdone->prefix,
                                                     *(xmlChar **)(ns->prefix + 0x18)), iVar6 != 0))
                               )) {
                        *(int *)&ns->_private = ancestorsOnly;
                      }
                    }
                  }
                  pxVar9 = xmlDOMWrapNsMapAddItem
                                     ((xmlNsMapPtr *)&mi,-1,_parnsdone,(xmlNsPtr)newNs,ancestorsOnly
                                     );
                  if (pxVar9 == (xmlNsMapItemPtr_conflict)0x0) goto LAB_0016c862;
                }
                dict = newNs;
              }
            }
            goto LAB_0016c38f;
          case XML_ATTRIBUTE_NODE:
LAB_0016c38f:
            if (cloneElem->ns != (xmlNs *)0x0) {
              if (!bVar4) {
                if (((pxStack_40 != (xmlNodePtr)0x0) && (sourceDoc_local == (xmlDocPtr)0x0)) &&
                   (iVar6 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,pxStack_40),
                   iVar6 == -1)) break;
                bVar4 = true;
              }
              if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
                for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
                  if ((*(int *)&ns->_private == -1) && (cloneElem->ns == (xmlNs *)ns->href)) {
                    parentClone->ns = (xmlNs *)ns->prefix;
                    goto LAB_0016c548;
                  }
                }
              }
              if ((sourceDoc_local == (xmlDocPtr)0x0) ||
                 (sourceDoc_local->children == (_xmlNode *)0x0)) {
                if (pxStack_40 == (xmlNodePtr)0x0) {
                  local_f0 = (xmlNodePtr)0x0;
                }
                else {
                  local_f0 = (xmlNodePtr)nsMap;
                }
                iVar6 = xmlDOMWrapNSNormAcquireNormalizedNs
                                  ((xmlDocPtr)destParent_local,local_f0,cloneElem->ns,
                                   (xmlNsPtr *)&parnsdone,(xmlNsMapPtr *)&mi,ancestorsOnly,0,
                                   (uint)(cloneElem->type == XML_ATTRIBUTE_NODE));
                if (iVar6 != -1) {
                  parentClone->ns = _parnsdone;
                  goto LAB_0016c548;
                }
              }
              else {
                _parnsdone = (xmlNsPtr)
                             (*(code *)sourceDoc_local->children)
                                       (sourceDoc_local,cloneElem,cloneElem->ns->href,
                                        cloneElem->ns->prefix);
                pxVar9 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&mi,-1,cloneElem->ns,_parnsdone,-4);
                if (pxVar9 != (xmlNsMapItemPtr_conflict)0x0) {
                  parentClone->ns = _parnsdone;
                  goto LAB_0016c548;
                }
              }
              break;
            }
LAB_0016c548:
            if ((parentClone->type == XML_ATTRIBUTE_NODE) &&
               (parentClone->parent != (_xmlNode *)0x0)) {
              iVar6 = xmlIsID((xmlDocPtr)destParent_local,parentClone->parent,
                              (xmlAttrPtr)parentClone);
              if (-1 < iVar6) {
                if (iVar6 != 1) goto LAB_0016c604;
                pxVar7 = xmlNodeGetContent(cloneElem);
                if (pxVar7 != (xmlChar *)0x0) {
                  iVar6 = xmlAddIDSafe((xmlAttrPtr)cloneElem,pxVar7);
                  if (-1 < iVar6) {
                    (*xmlFree)(pxVar7);
                    goto LAB_0016c604;
                  }
                  (*xmlFree)(pxVar7);
                }
              }
              break;
            }
LAB_0016c604:
            if ((cloneElem->type == XML_ELEMENT_NODE) && (cloneElem->properties != (_xmlAttr *)0x0))
            {
              cloneNs = (xmlNsPtr)0x0;
              prevClone = parentClone;
              cloneElem = (xmlNodePtr)cloneElem->properties;
            }
            else {
              for (; (cloneElem->children == (_xmlNode *)0x0 ||
                     ((deep == 0 && (cloneElem->type != XML_ATTRIBUTE_NODE))));
                  cloneElem = cloneElem->parent) {
LAB_0016c68e:
                while( true ) {
                  if (cloneElem == (xmlNodePtr)resNode_local) goto LAB_0016c869;
                  if (((cloneElem->type == XML_ELEMENT_NODE) ||
                      (cloneElem->type == XML_XINCLUDE_START)) ||
                     (cloneElem->type == XML_XINCLUDE_END)) {
                    if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0))
                    {
                      while( true ) {
                        bVar3 = false;
                        if (mi->prev != (xmlNsMapItemPtr)0x0) {
                          bVar3 = ancestorsOnly <= mi->prev->depth;
                        }
                        if (!bVar3) break;
                        pxVar2 = (xmlNsPtr)mi->prev;
                        mi->prev = *(xmlNsMapItemPtr *)&pxVar2->type;
                        if (mi->prev == (xmlNsMapItemPtr)0x0) {
                          mi->next = (xmlNsMapItemPtr)0x0;
                        }
                        else {
                          mi->prev->next = (xmlNsMapItemPtr)0x0;
                        }
                        pxVar2->next = mi->oldNs;
                        mi->oldNs = pxVar2;
                      }
                      for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
                        if (ancestorsOnly <= *(int *)&ns->_private) {
                          *(undefined4 *)&ns->_private = 0xffffffff;
                        }
                      }
                    }
                    ancestorsOnly = ancestorsOnly + -1;
                  }
                  if (cloneElem->next != (_xmlNode *)0x0) {
                    cloneNs = (xmlNsPtr)parentClone;
                    cloneElem = cloneElem->next;
                    goto LAB_0016bd0a;
                  }
                  if (cloneElem->type == XML_ATTRIBUTE_NODE) break;
                  parentClone = parentClone->parent;
                  if (parentClone != (_xmlNode *)0x0) {
                    prevClone = parentClone->parent;
                  }
                  cloneElem = cloneElem->parent;
                }
                parentClone = parentClone->parent;
                prevClone = parentClone->parent;
              }
              cloneNs = (xmlNsPtr)0x0;
              prevClone = parentClone;
              cloneElem = cloneElem->children;
            }
            goto LAB_0016bd0a;
          case XML_TEXT_NODE:
          case XML_CDATA_SECTION_NODE:
          case XML_PI_NODE:
          case XML_COMMENT_NODE:
            if (cloneElem->content == (xmlChar *)0x0) goto LAB_0016c68e;
            pxVar7 = xmlStrdup(cloneElem->content);
            parentClone->content = pxVar7;
            if (parentClone->content != (xmlChar *)0x0) goto LAB_0016c68e;
            break;
          case XML_ENTITY_REF_NODE:
            if (node_local == destParent_local) {
              parentClone->content = cloneElem->content;
              parentClone->children = cloneElem->children;
              parentClone->last = cloneElem->last;
              goto LAB_0016c68e;
            }
            if ((destParent_local->content == (xmlChar *)0x0) &&
               (destParent_local->properties == (_xmlAttr *)0x0)) goto LAB_0016c68e;
            pxVar8 = xmlGetDocEntity((xmlDoc *)destParent_local,cloneElem->name);
            if (pxVar8 == (xmlEntityPtr)0x0) goto LAB_0016c68e;
            parentClone->content = pxVar8->content;
            parentClone->children = (_xmlNode *)pxVar8;
            parentClone->last = (_xmlNode *)pxVar8;
            goto LAB_0016c68e;
          default:
            break;
          case XML_XINCLUDE_START:
          case XML_XINCLUDE_END:
            return -1;
          }
LAB_0016c862:
          cur._4_4_ = -1;
        }
LAB_0016c869:
        if (mi != (xmlNsMapItemPtr_conflict)0x0) {
          if ((sourceDoc_local == (xmlDocPtr)0x0) ||
             ((xmlNsMapItemPtr_conflict)sourceDoc_local->name != mi)) {
            xmlDOMWrapNsMapFree((xmlNsMapPtr)mi);
          }
          else if (mi->next != (xmlNsMapItemPtr)0x0) {
            if (mi->oldNs != (xmlNsPtr)0x0) {
              mi->prev->next = (xmlNsMapItemPtr)mi->oldNs;
            }
            mi->oldNs = (xmlNsPtr)mi->next;
            mi->next = (xmlNsMapItemPtr)0x0;
          }
        }
        destDoc_local->_private = clone;
        ctxt_local._4_4_ = cur._4_4_;
      }
    }
    else {
      ctxt_local._4_4_ = -1;
    }
  }
  else {
    ctxt_local._4_4_ = 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, cloneElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
                    parentClone->last = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
		clone = xmlMalloc(sizeof(xmlAttr));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
            if (dict != NULL)
                clone->name = xmlDictLookup(dict, cur->name, -1);
            else
                clone->name = xmlStrdup(cur->name);
            if (clone->name == NULL)
                goto internal_error;
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		cloneElem = clone;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL)
			    goto internal_error;
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL) {
			    cloneNs->href = xmlStrdup(ns->href);
                            if (cloneNs->href == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }
			if (ns->prefix != NULL) {
			    cloneNs->prefix = xmlStrdup(ns->prefix);
                            if (cloneNs->prefix == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
                if (cur->content != NULL) {
                    clone->content = xmlStrdup(cur->content);
                    if (clone->content == NULL)
                        goto internal_error;
                }
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on cloneElem or on destDoc->oldNs */
		destParent ? cloneElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
            int res;

	    res = xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone);
            if (res < 0)
                goto internal_error;
            if (res == 1) {
		xmlChar *idVal;

		idVal = xmlNodeGetContent(cur);
                if (idVal == NULL)
                    goto internal_error;
                if (xmlAddIDSafe((xmlAttrPtr) cur, idVal) < 0) {
                    xmlFree(idVal);
                    goto internal_error;
                }
                xmlFree(idVal);
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}